

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall Assimp::ColladaExporter::WriteAnimationLibrary(ColladaExporter *this,size_t pIndex)

{
  undefined1 *puVar1;
  string *psVar2;
  string *psVar3;
  aiQuaternion *paVar4;
  aiNodeAnim *paVar5;
  aiVectorKey *paVar6;
  pointer __position;
  int iVar7;
  ostream *poVar8;
  float *__first;
  float *pfVar9;
  ulong uVar10;
  size_t i_1;
  long lVar11;
  char *pcVar12;
  size_t i;
  ulong uVar13;
  uint j;
  uint p_iIndex;
  allocator<char> local_241;
  aiAnimation *local_240;
  string arrayId;
  vector<float,_std::allocator<float>_> frames;
  aiMatrix4x4t<float> temp;
  vector<float,_std::allocator<float>_> keyframes;
  string node_idstr;
  string idstr;
  aiMatrix4x4 mat;
  string ending;
  aiQuaternion RotationQ;
  string idstrEscaped;
  string animation_name_escaped;
  
  local_240 = this->mScene->mAnimations[pIndex];
  if (((local_240->mNumChannels == 0) && (local_240->mNumMeshChannels == 0)) &&
     (local_240->mNumMorphMeshChannels == 0)) {
    return;
  }
  pcVar12 = (local_240->mName).data;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&frames,pcVar12,(allocator<char> *)&arrayId);
  XMLEscape(&animation_name_escaped,(string *)&frames);
  std::__cxx11::string::~string((string *)&frames);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&idstr,pcVar12,(allocator<char> *)&frames);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&frames,"AnimId",(allocator<char> *)&mat);
  to_string<unsigned_long>(&arrayId,pIndex);
  std::operator+(&ending,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &frames,&arrayId);
  std::__cxx11::string::~string((string *)&arrayId);
  std::__cxx11::string::~string((string *)&frames);
  if (idstr._M_string_length < ending._M_string_length) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frames,
                   &idstr,&ending);
  }
  else {
    iVar7 = std::__cxx11::string::compare
                      ((ulong)&idstr,idstr._M_string_length - ending._M_string_length,
                       (string *)ending._M_string_length);
    if (iVar7 == 0) goto LAB_0032fcd2;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frames,
                   &idstr,&ending);
  }
  std::__cxx11::string::operator=((string *)&idstr,(string *)&frames);
  std::__cxx11::string::~string((string *)&frames);
LAB_0032fcd2:
  XMLIDEncode(&idstrEscaped,&idstr);
  puVar1 = &this->field_0x38;
  psVar2 = &this->startstr;
  poVar8 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp,
                 "<animation id=\"",&idstrEscaped);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp,
                 "\" name=\"");
  std::operator+(&arrayId,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat,
                 &animation_name_escaped);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frames,
                 &arrayId,"\">");
  poVar8 = std::operator<<(poVar8,(string *)&frames);
  psVar3 = &this->endstr;
  std::operator<<(poVar8,(string *)psVar3);
  std::__cxx11::string::~string((string *)&frames);
  std::__cxx11::string::~string((string *)&arrayId);
  std::__cxx11::string::~string((string *)&mat);
  std::__cxx11::string::~string((string *)&temp);
  PushTag(this);
  node_idstr._M_dataplus._M_p = (pointer)&node_idstr.field_2;
  node_idstr._M_string_length = 0;
  node_idstr.field_2._M_local_buf[0] = '\0';
  uVar10 = 0;
  do {
    uVar13 = (ulong)local_240->mNumChannels;
    if (uVar13 <= uVar10) {
      for (uVar10 = 0; uVar10 < uVar13; uVar10 = uVar10 + 1) {
        paVar5 = local_240->mChannels[uVar10];
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&arrayId,"_matrix-sampler",(allocator<char> *)&mat);
        pcVar12 = (paVar5->mNodeName).data;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frames,
                       pcVar12,&arrayId);
        std::__cxx11::string::~string((string *)&arrayId);
        poVar8 = std::operator<<((ostream *)puVar1,(string *)psVar2);
        poVar8 = std::operator<<(poVar8,"<sampler id=\"");
        XMLIDEncode(&arrayId,(string *)&frames);
        poVar8 = std::operator<<(poVar8,(string *)&arrayId);
        poVar8 = std::operator<<(poVar8,"\">");
        std::operator<<(poVar8,(string *)psVar3);
        std::__cxx11::string::~string((string *)&arrayId);
        PushTag(this);
        poVar8 = std::operator<<((ostream *)puVar1,(string *)psVar2);
        poVar8 = std::operator<<(poVar8,"<input semantic=\"INPUT\" source=\"#");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&temp,"_matrix-input",(allocator<char> *)&keyframes);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat,
                       pcVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &temp);
        XMLIDEncode(&arrayId,(string *)&mat);
        poVar8 = std::operator<<(poVar8,(string *)&arrayId);
        poVar8 = std::operator<<(poVar8,"\"/>");
        std::operator<<(poVar8,(string *)psVar3);
        std::__cxx11::string::~string((string *)&arrayId);
        std::__cxx11::string::~string((string *)&mat);
        std::__cxx11::string::~string((string *)&temp);
        poVar8 = std::operator<<((ostream *)puVar1,(string *)psVar2);
        poVar8 = std::operator<<(poVar8,"<input semantic=\"OUTPUT\" source=\"#");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&temp,"_matrix-output",(allocator<char> *)&keyframes);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat,
                       pcVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &temp);
        XMLIDEncode(&arrayId,(string *)&mat);
        poVar8 = std::operator<<(poVar8,(string *)&arrayId);
        poVar8 = std::operator<<(poVar8,"\"/>");
        std::operator<<(poVar8,(string *)psVar3);
        std::__cxx11::string::~string((string *)&arrayId);
        std::__cxx11::string::~string((string *)&mat);
        std::__cxx11::string::~string((string *)&temp);
        poVar8 = std::operator<<((ostream *)puVar1,(string *)psVar2);
        poVar8 = std::operator<<(poVar8,"<input semantic=\"INTERPOLATION\" source=\"#");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&temp,"_matrix-interpolation",(allocator<char> *)&keyframes);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat,
                       pcVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &temp);
        XMLIDEncode(&arrayId,(string *)&mat);
        poVar8 = std::operator<<(poVar8,(string *)&arrayId);
        poVar8 = std::operator<<(poVar8,"\"/>");
        std::operator<<(poVar8,(string *)psVar3);
        std::__cxx11::string::~string((string *)&arrayId);
        std::__cxx11::string::~string((string *)&mat);
        std::__cxx11::string::~string((string *)&temp);
        PopTag(this);
        poVar8 = std::operator<<((ostream *)puVar1,(string *)psVar2);
        poVar8 = std::operator<<(poVar8,"</sampler>");
        std::operator<<(poVar8,(string *)psVar3);
        std::__cxx11::string::~string((string *)&frames);
        uVar13 = (ulong)local_240->mNumChannels;
      }
      for (uVar10 = 0; uVar10 < uVar13; uVar10 = uVar10 + 1) {
        paVar5 = local_240->mChannels[uVar10];
        poVar8 = std::operator<<((ostream *)puVar1,(string *)psVar2);
        poVar8 = std::operator<<(poVar8,"<channel source=\"#");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&mat,"_matrix-sampler",(allocator<char> *)&RotationQ);
        pcVar12 = (paVar5->mNodeName).data;
        std::operator+(&arrayId,pcVar12,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat);
        XMLIDEncode((string *)&frames,&arrayId);
        poVar8 = std::operator<<(poVar8,(string *)&frames);
        poVar8 = std::operator<<(poVar8,"\" target=\"");
        std::__cxx11::string::string<std::allocator<char>>((string *)&keyframes,pcVar12,&local_241);
        XMLIDEncode((string *)&temp,(string *)&keyframes);
        poVar8 = std::operator<<(poVar8,(string *)&temp);
        poVar8 = std::operator<<(poVar8,"/matrix\"/>");
        std::operator<<(poVar8,(string *)psVar3);
        std::__cxx11::string::~string((string *)&temp);
        std::__cxx11::string::~string((string *)&keyframes);
        std::__cxx11::string::~string((string *)&frames);
        std::__cxx11::string::~string((string *)&arrayId);
        std::__cxx11::string::~string((string *)&mat);
        uVar13 = (ulong)local_240->mNumChannels;
      }
      PopTag(this);
      poVar8 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar8 = std::operator<<(poVar8,"</animation>");
      std::operator<<(poVar8,(string *)psVar3);
      std::__cxx11::string::~string((string *)&node_idstr);
      std::__cxx11::string::~string((string *)&idstrEscaped);
      std::__cxx11::string::~string((string *)&ending);
      std::__cxx11::string::~string((string *)&idstr);
      std::__cxx11::string::~string((string *)&animation_name_escaped);
      return;
    }
    paVar5 = local_240->mChannels[uVar10];
    if ((paVar5->mNumPositionKeys == paVar5->mNumScalingKeys) &&
       (paVar5->mNumPositionKeys == paVar5->mNumRotationKeys)) {
      node_idstr._M_string_length = 0;
      *node_idstr._M_dataplus._M_p = '\0';
      std::__cxx11::string::append((char *)&node_idstr);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&frames,"_matrix-input",(allocator<char> *)&arrayId);
      std::__cxx11::string::append((string *)&node_idstr);
      std::__cxx11::string::~string((string *)&frames);
      frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 0;
      frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 0.0;
      frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0.0;
      frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start._4_4_ = 0;
      frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0.0;
      frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      lVar11 = 0;
      for (uVar13 = 0; uVar13 < paVar5->mNumPositionKeys; uVar13 = uVar13 + 1) {
        arrayId._M_dataplus._M_p._0_4_ =
             (float)*(double *)((long)&paVar5->mPositionKeys->mTime + lVar11);
        std::vector<float,_std::allocator<float>_>::emplace_back<float>(&frames,(float *)&arrayId);
        lVar11 = lVar11 + 0x18;
      }
      WriteFloatArray(this,&node_idstr,FloatType_Time,
                      (ai_real *)
                      CONCAT44(frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,
                               frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start._0_4_),
                      CONCAT44(frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish._4_4_,
                               frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish._0_4_) -
                      (long)CONCAT44(frames.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     frames.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_4_) >> 2);
      if (CONCAT44(frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish._4_4_,
                   frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish._0_4_) !=
          CONCAT44(frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_,
                   frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start._0_4_)) {
        frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ =
             frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start._0_4_;
        frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._4_4_ =
             frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_;
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&frames);
      node_idstr._M_string_length = 0;
      *node_idstr._M_dataplus._M_p = '\0';
      std::__cxx11::string::append((char *)&node_idstr);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&frames,"_matrix-output",(allocator<char> *)&arrayId);
      std::__cxx11::string::append((string *)&node_idstr);
      std::__cxx11::string::~string((string *)&frames);
      keyframes.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      keyframes.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      keyframes.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      std::vector<float,_std::allocator<float>_>::reserve
                (&keyframes,(ulong)(paVar5->mNumPositionKeys << 4));
      for (uVar13 = 0; uVar13 < paVar5->mNumPositionKeys; uVar13 = uVar13 + 1) {
        frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = paVar5->mScalingKeys[uVar13].mValue.x;
        frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = paVar5->mScalingKeys[uVar13].mValue.y;
        frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._4_4_ = 0;
        frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = 0.0;
        frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._4_4_ = 0;
        frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = 0;
        paVar4 = &paVar5->mRotationKeys[uVar13].mValue;
        RotationQ.w = paVar4->w;
        RotationQ.x = paVar4->x;
        RotationQ.y = paVar4->y;
        RotationQ.z = paVar4->z;
        aiQuaterniont<float>::GetMatrix((aiMatrix3x3t<float> *)&arrayId,&RotationQ);
        arrayId.field_2._8_4_ = arrayId.field_2._M_allocated_capacity._4_4_;
        arrayId.field_2._M_allocated_capacity._4_4_ = arrayId.field_2._M_allocated_capacity._0_4_;
        arrayId.field_2._M_allocated_capacity._0_4_ = arrayId._M_string_length._4_4_;
        arrayId._M_string_length._4_4_ = 0;
        arrayId.field_2._12_4_ = 0;
        paVar6 = paVar5->mPositionKeys;
        temp.a4 = paVar6[uVar13].mValue.x;
        temp.b4 = paVar6[uVar13].mValue.y;
        temp.c4 = paVar6[uVar13].mValue.z;
        temp.a1 = 1.0;
        temp.a2 = 0.0;
        temp.a3 = 0.0;
        temp.b1 = 0.0;
        temp.b2 = 1.0;
        temp.b3 = 0.0;
        temp.c1 = 0.0;
        temp.c2 = 0.0;
        temp.c3 = 1.0;
        temp.d3 = 0.0;
        temp.d1 = 0.0;
        temp.d2 = 0.0;
        temp.d4 = 1.0;
        aiMatrix4x4t<float>::operator*=(&temp,(aiMatrix4x4t<float> *)&arrayId);
        mat.a2 = temp.a2;
        mat.a1 = temp.a1;
        mat.a4 = temp.a4;
        mat.a3 = temp.a3;
        mat.b4 = temp.b4;
        mat.b3 = temp.b3;
        mat.c4 = temp.c4;
        mat.c3 = temp.c3;
        mat.d1 = temp.d1;
        mat.d2 = temp.d2;
        mat.d3 = temp.d3;
        mat.d4 = temp.d4;
        mat.c1 = temp.c1;
        mat.c2 = temp.c2;
        mat.b1 = temp.b1;
        mat.b2 = temp.b2;
        aiMatrix4x4t<float>::operator*=(&mat,(aiMatrix4x4t<float> *)&frames);
        for (p_iIndex = 0;
            __position = keyframes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish, p_iIndex != 4; p_iIndex = p_iIndex + 1)
        {
          __first = aiMatrix4x4t<float>::operator[](&mat,p_iIndex);
          pfVar9 = aiMatrix4x4t<float>::operator[](&mat,p_iIndex);
          std::vector<float,std::allocator<float>>::insert<float*,void>
                    ((vector<float,std::allocator<float>> *)&keyframes,(const_iterator)__position,
                     __first,pfVar9 + 4);
        }
      }
      WriteFloatArray(this,&node_idstr,FloatType_Mat4x4,
                      keyframes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (ulong)((long)keyframes.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)keyframes.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2) >> 4);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&keyframes.super__Vector_base<float,_std::allocator<float>_>);
      temp.a1 = 0.0;
      temp.a2 = 0.0;
      temp.a3 = 0.0;
      temp.a4 = 0.0;
      temp.b1 = 0.0;
      temp.b2 = 0.0;
      for (uVar13 = 0; uVar13 < paVar5->mNumPositionKeys; uVar13 = uVar13 + 1) {
        if ((paVar5->mPreState < 4) && (paVar5->mPreState != aiAnimBehaviour_CONSTANT)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&frames,"LINEAR",(allocator<char> *)&arrayId);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&temp,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frames);
LAB_00330284:
          std::__cxx11::string::~string((string *)&frames);
        }
        else if (paVar5->mPostState == aiAnimBehaviour_CONSTANT) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&frames,"STEP",(allocator<char> *)&arrayId);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&temp,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frames);
          goto LAB_00330284;
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&arrayId,"_matrix-interpolation",(allocator<char> *)&mat);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frames,
                     (paVar5->mNodeName).data,&arrayId);
      std::__cxx11::string::~string((string *)&arrayId);
      XMLIDEncode((string *)&mat,(string *)&frames);
      std::operator+(&arrayId,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &mat,"-array");
      std::__cxx11::string::~string((string *)&mat);
      poVar8 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar8 = std::operator<<(poVar8,"<source id=\"");
      XMLIDEncode((string *)&mat,(string *)&frames);
      poVar8 = std::operator<<(poVar8,(string *)&mat);
      poVar8 = std::operator<<(poVar8,"\">");
      std::operator<<(poVar8,(string *)psVar3);
      std::__cxx11::string::~string((string *)&mat);
      PushTag(this);
      poVar8 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar8 = std::operator<<(poVar8,"<Name_array id=\"");
      poVar8 = std::operator<<(poVar8,(string *)&arrayId);
      poVar8 = std::operator<<(poVar8,"\" count=\"");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::operator<<(poVar8,"\"> ");
      lVar11 = 0;
      for (uVar13 = 0; uVar13 < (ulong)(CONCAT44(temp.a4,temp.a3) - CONCAT44(temp.a2,temp.a1) >> 5);
          uVar13 = uVar13 + 1) {
        poVar8 = std::operator<<((ostream *)puVar1,(string *)(CONCAT44(temp.a2,temp.a1) + lVar11));
        std::operator<<(poVar8," ");
        lVar11 = lVar11 + 0x20;
      }
      poVar8 = std::operator<<((ostream *)puVar1,"</Name_array>");
      std::operator<<(poVar8,(string *)psVar3);
      poVar8 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar8 = std::operator<<(poVar8,"<technique_common>");
      std::operator<<(poVar8,(string *)psVar3);
      PushTag(this);
      poVar8 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar8 = std::operator<<(poVar8,"<accessor source=\"#");
      poVar8 = std::operator<<(poVar8,(string *)&arrayId);
      poVar8 = std::operator<<(poVar8,"\" count=\"");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      poVar8 = std::operator<<(poVar8,"\" stride=\"");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,1);
      poVar8 = std::operator<<(poVar8,"\">");
      std::operator<<(poVar8,(string *)psVar3);
      PushTag(this);
      poVar8 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar8 = std::operator<<(poVar8,"<param name=\"INTERPOLATION\" type=\"name\"></param>");
      std::operator<<(poVar8,(string *)psVar3);
      PopTag(this);
      poVar8 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar8 = std::operator<<(poVar8,"</accessor>");
      std::operator<<(poVar8,(string *)psVar3);
      PopTag(this);
      poVar8 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar8 = std::operator<<(poVar8,"</technique_common>");
      std::operator<<(poVar8,(string *)psVar3);
      PopTag(this);
      poVar8 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar8 = std::operator<<(poVar8,"</source>");
      std::operator<<(poVar8,(string *)psVar3);
      std::__cxx11::string::~string((string *)&arrayId);
      std::__cxx11::string::~string((string *)&frames);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&temp);
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void ColladaExporter::WriteAnimationLibrary(size_t pIndex)
{
	const aiAnimation * anim = mScene->mAnimations[pIndex];
	
	if ( anim->mNumChannels == 0 && anim->mNumMeshChannels == 0 && anim->mNumMorphMeshChannels ==0 )
		return;
	
	const std::string animation_name_escaped = XMLEscape( anim->mName.C_Str() );
	std::string idstr = anim->mName.C_Str();
	std::string ending = std::string( "AnimId" ) + to_string(pIndex);
	if (idstr.length() >= ending.length()) {
		if (0 != idstr.compare (idstr.length() - ending.length(), ending.length(), ending)) {
			idstr = idstr + ending;
		}
	} else {
		idstr = idstr + ending;
	}

	const std::string idstrEscaped = XMLIDEncode(idstr);
	
	mOutput << startstr << "<animation id=\"" + idstrEscaped + "\" name=\"" + animation_name_escaped + "\">" << endstr;
	PushTag();

    std::string node_idstr;
	for (size_t a = 0; a < anim->mNumChannels; ++a) {
		const aiNodeAnim * nodeAnim = anim->mChannels[a];
		
		// sanity check
		if ( nodeAnim->mNumPositionKeys != nodeAnim->mNumScalingKeys ||  nodeAnim->mNumPositionKeys != nodeAnim->mNumRotationKeys ) continue;
		
		{
            node_idstr.clear();
            node_idstr += nodeAnim->mNodeName.data;
            node_idstr += std::string( "_matrix-input" );

			std::vector<ai_real> frames;
			for( size_t i = 0; i < nodeAnim->mNumPositionKeys; ++i) {
				frames.push_back(static_cast<ai_real>(nodeAnim->mPositionKeys[i].mTime));
			}
			
			WriteFloatArray( node_idstr , FloatType_Time, (const ai_real*) frames.data(), frames.size());
			frames.clear();
		}
		
		{
            node_idstr.clear();

            node_idstr += nodeAnim->mNodeName.data;
            node_idstr += std::string("_matrix-output");
			
			std::vector<ai_real> keyframes;
			keyframes.reserve(nodeAnim->mNumPositionKeys * 16);
			for( size_t i = 0; i < nodeAnim->mNumPositionKeys; ++i) {
				aiVector3D Scaling = nodeAnim->mScalingKeys[i].mValue;
				aiMatrix4x4 ScalingM;  // identity
				ScalingM[0][0] = Scaling.x; ScalingM[1][1] = Scaling.y; ScalingM[2][2] = Scaling.z;
				
				aiQuaternion RotationQ = nodeAnim->mRotationKeys[i].mValue;
				aiMatrix4x4 s = aiMatrix4x4( RotationQ.GetMatrix() );
				aiMatrix4x4 RotationM(s.a1, s.a2, s.a3, 0, s.b1, s.b2, s.b3, 0, s.c1, s.c2, s.c3, 0, 0, 0, 0, 1);
				
				aiVector3D Translation = nodeAnim->mPositionKeys[i].mValue;
				aiMatrix4x4 TranslationM;	// identity
				TranslationM[0][3] = Translation.x; TranslationM[1][3] = Translation.y; TranslationM[2][3] = Translation.z;
				
				// Combine the above transformations
				aiMatrix4x4 mat = TranslationM * RotationM * ScalingM;
				
				for( unsigned int j = 0; j < 4; ++j) {
					keyframes.insert(keyframes.end(), mat[j], mat[j] + 4);
                }
			}
			
			WriteFloatArray( node_idstr, FloatType_Mat4x4, (const ai_real*) keyframes.data(), keyframes.size() / 16);
		}
		
		{
			std::vector<std::string> names;
			for ( size_t i = 0; i < nodeAnim->mNumPositionKeys; ++i) {
				if ( nodeAnim->mPreState == aiAnimBehaviour_DEFAULT
					|| nodeAnim->mPreState == aiAnimBehaviour_LINEAR
					|| nodeAnim->mPreState == aiAnimBehaviour_REPEAT
					) {
					names.push_back( "LINEAR" );
				} else if (nodeAnim->mPostState == aiAnimBehaviour_CONSTANT) {
					names.push_back( "STEP" );
				}
			}
			
			const std::string node_idstr = nodeAnim->mNodeName.data + std::string("_matrix-interpolation");
            std::string arrayId = XMLIDEncode(node_idstr) + "-array";
			
			mOutput << startstr << "<source id=\"" << XMLIDEncode(node_idstr) << "\">" << endstr;
			PushTag();
			
			// source array
			mOutput << startstr << "<Name_array id=\"" << arrayId << "\" count=\"" << names.size() << "\"> ";
			for( size_t a = 0; a < names.size(); ++a ) {
				mOutput << names[a] << " ";
            }
			mOutput << "</Name_array>" << endstr;
			
			mOutput << startstr << "<technique_common>" << endstr;
			PushTag();

			mOutput << startstr << "<accessor source=\"#" << arrayId << "\" count=\"" << names.size() << "\" stride=\"" << 1 << "\">" << endstr;
			PushTag();
			
			mOutput << startstr << "<param name=\"INTERPOLATION\" type=\"name\"></param>" << endstr;
			
			PopTag();
			mOutput << startstr << "</accessor>" << endstr;
			
			PopTag();
			mOutput << startstr << "</technique_common>" << endstr;

			PopTag();
			mOutput << startstr << "</source>" << endstr;
		}
	}
	
	for (size_t a = 0; a < anim->mNumChannels; ++a) {
		const aiNodeAnim * nodeAnim = anim->mChannels[a];
		
		{
		// samplers
			const std::string node_idstr = nodeAnim->mNodeName.data + std::string("_matrix-sampler");
			mOutput << startstr << "<sampler id=\"" << XMLIDEncode(node_idstr) << "\">" << endstr;
			PushTag();
			
			mOutput << startstr << "<input semantic=\"INPUT\" source=\"#" << XMLIDEncode( nodeAnim->mNodeName.data + std::string("_matrix-input") ) << "\"/>" << endstr;
			mOutput << startstr << "<input semantic=\"OUTPUT\" source=\"#" << XMLIDEncode( nodeAnim->mNodeName.data + std::string("_matrix-output") ) << "\"/>" << endstr;
			mOutput << startstr << "<input semantic=\"INTERPOLATION\" source=\"#" << XMLIDEncode( nodeAnim->mNodeName.data + std::string("_matrix-interpolation") ) << "\"/>" << endstr;
			
			PopTag();
			mOutput << startstr << "</sampler>" << endstr;
		}
	}
	
	for (size_t a = 0; a < anim->mNumChannels; ++a) {
		const aiNodeAnim * nodeAnim = anim->mChannels[a];
		
		{
		// channels
			mOutput << startstr << "<channel source=\"#" << XMLIDEncode( nodeAnim->mNodeName.data + std::string("_matrix-sampler") ) << "\" target=\"" << XMLIDEncode(nodeAnim->mNodeName.data) << "/matrix\"/>" << endstr;
		}
	}
	
	PopTag();
	mOutput << startstr << "</animation>" << endstr;
	
}